

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::StructColumnData::GetColumnSegmentInfo
          (StructColumnData *this,idx_t row_group_index,vector<unsigned_long,_true> *col_path,
          vector<duckdb::ColumnSegmentInfo,_true> *result)

{
  iterator __position;
  reference pvVar1;
  reference this_00;
  pointer pCVar2;
  size_type __n;
  ulong uVar3;
  unsigned_long local_68;
  void *local_60 [3];
  void *local_48 [3];
  
  local_68 = 0;
  __position._M_current =
       (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)col_path,__position,
               &local_68);
  }
  else {
    *__position._M_current = 0;
    (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
             &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnData::GetColumnSegmentInfo
            (&(this->validity).super_ColumnData,row_group_index,
             (vector<unsigned_long,_true> *)local_48,result);
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0]);
  }
  if ((this->sub_columns).
      super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->sub_columns).
      super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      uVar3 = __n + 1;
      pvVar1 = vector<unsigned_long,_true>::back(col_path);
      *pvVar1 = uVar3;
      this_00 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                ::operator[](&this->sub_columns,__n);
      pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(this_00);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                 &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      (*pCVar2->_vptr_ColumnData[0x21])
                (pCVar2,row_group_index,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,result);
      if (local_60[0] != (void *)0x0) {
        operator_delete(local_60[0]);
      }
      __n = uVar3;
    } while (uVar3 < (ulong)((long)(this->sub_columns).
                                   super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->sub_columns).
                                   super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void StructColumnData::GetColumnSegmentInfo(duckdb::idx_t row_group_index, vector<duckdb::idx_t> col_path,
                                            vector<duckdb::ColumnSegmentInfo> &result) {
	col_path.push_back(0);
	validity.GetColumnSegmentInfo(row_group_index, col_path, result);
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		col_path.back() = i + 1;
		sub_columns[i]->GetColumnSegmentInfo(row_group_index, col_path, result);
	}
}